

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encryptor_test.cpp
# Opt level: O2

void test_key(string *test_dir)

{
  ostream *poVar1;
  long lVar2;
  short *psVar3;
  int *piVar4;
  char *pcVar5;
  runtime_error *prVar6;
  key local_1e0 [32];
  key k;
  key k3;
  key k2;
  ostringstream oss;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"- Testing key");
  std::endl<char,std::char_traits<char>>(poVar1);
  cppcms::crypto::key::key(&k);
  cppcms::crypto::key::set_hex((char *)&k,0x1096aa);
  lVar2 = cppcms::crypto::key::size();
  if (lVar2 != 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xa4);
    std::operator<<(poVar1," k.size()==2");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)local_1e0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  psVar3 = (short *)cppcms::crypto::key::data();
  if (*psVar3 != -0x4456) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xa5);
    std::operator<<(poVar1," memcmp(k.data(),\"\\xaa\\xbb\",2)==0");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)local_1e0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::crypto::key::set(&k,0x1096aa);
  lVar2 = cppcms::crypto::key::size();
  if (lVar2 != 4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xa7);
    std::operator<<(poVar1," k.size()==4");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)local_1e0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  piVar4 = (int *)cppcms::crypto::key::data();
  if (*piVar4 != 0x62626161) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xa8);
    std::operator<<(poVar1," memcmp(k.data(),\"aabb\",4)==0");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)local_1e0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)&oss,"ab",(allocator *)&k2);
  cppcms::crypto::key::key(local_1e0,(string *)&oss);
  cppcms::crypto::key::operator=(&k,local_1e0);
  cppcms::crypto::key::~key(local_1e0);
  std::__cxx11::string::~string((string *)&oss);
  lVar2 = cppcms::crypto::key::size();
  if (lVar2 != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xaa);
    std::operator<<(poVar1," k.size()==1");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)local_1e0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar5 = (char *)cppcms::crypto::key::data();
  if (*pcVar5 != -0x55) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xab);
    std::operator<<(poVar1," *k.data()==\'\\xAB\'");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)local_1e0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::crypto::key::key(&k2,&k);
  lVar2 = cppcms::crypto::key::size();
  if (lVar2 != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xad);
    std::operator<<(poVar1," k2.size()==1");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)local_1e0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar5 = (char *)cppcms::crypto::key::data();
  if (*pcVar5 == -0x55) {
    cppcms::crypto::key::key(&k3);
    lVar2 = cppcms::crypto::key::size();
    if (lVar2 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar1 = std::operator<<((ostream *)&oss,"Error ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xb0);
      std::operator<<(poVar1," k3.size()==0");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)local_1e0);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cppcms::crypto::key::operator=(&k3,&k);
    lVar2 = cppcms::crypto::key::size();
    if (lVar2 != 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar1 = std::operator<<((ostream *)&oss,"Error ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xb2);
      std::operator<<(poVar1," k3.size()==1");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)local_1e0);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar5 = (char *)cppcms::crypto::key::data();
    if (*pcVar5 != -0x55) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar1 = std::operator<<((ostream *)&oss,"Error ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xb3);
      std::operator<<(poVar1," *k3.data()==\'\\xAB\'");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)local_1e0);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                   test_dir,"/sample_key.txt");
    cppcms::crypto::key::read_from_file((string *)&k);
    std::__cxx11::string::~string((string *)&oss);
    lVar2 = cppcms::crypto::key::size();
    if (lVar2 == 4) {
      piVar4 = (int *)cppcms::crypto::key::data();
      if (*piVar4 == -0x2233fe55) {
        cppcms::crypto::key::~key(&k3);
        cppcms::crypto::key::~key(&k2);
        cppcms::crypto::key::~key(&k);
        return;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar1 = std::operator<<((ostream *)&oss,"Error ");
      poVar1 = std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                              );
      poVar1 = std::operator<<(poVar1,":");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xb6);
      std::operator<<(poVar1," memcmp(k.data(),\"\\xab\\x01\\xcc\\xdd\",4)==0");
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,(string *)local_1e0);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xb5);
    std::operator<<(poVar1," k.size()==4");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)local_1e0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostream *)&oss,"Error ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xae);
  std::operator<<(poVar1," *k2.data()==\'\\xAB\'");
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar6,(string *)local_1e0);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_key(std::string test_dir)
{
	std::cout << "- Testing key" << std::endl;
	cppcms::crypto::key k;
	k.set_hex("aabb",4);
	TEST(k.size()==2);
	TEST(memcmp(k.data(),"\xaa\xbb",2)==0);
	k.set("aabb",4);
	TEST(k.size()==4);
	TEST(memcmp(k.data(),"aabb",4)==0);
	k=cppcms::crypto::key(std::string("ab"));
	TEST(k.size()==1);
	TEST(*k.data()=='\xAB');
	cppcms::crypto::key k2(k);
	TEST(k2.size()==1);
	TEST(*k2.data()=='\xAB');
	cppcms::crypto::key k3;
	TEST(k3.size()==0);
	k3=k;
	TEST(k3.size()==1);
	TEST(*k3.data()=='\xAB');
	k.read_from_file(test_dir+"/sample_key.txt");
	TEST(k.size()==4);
	TEST(memcmp(k.data(),"\xab\x01\xcc\xdd",4)==0);
}